

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v11::detail::file_print_buffer<_IO_FILE,_void>::grow(buffer<char> *base,size_t param_2)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  char *ptr;
  
  __stream = (FILE *)base[1].ptr_;
  pcVar1 = __stream->_IO_write_ptr;
  sVar2 = base->size_;
  __stream->_IO_write_ptr = pcVar1 + sVar2;
  if (__stream->_IO_buf_end == pcVar1 + sVar2) {
    fflush_unlocked(__stream);
  }
  pcVar1 = *(char **)(base[1].ptr_ + 0x28);
  lVar3 = *(long *)(base[1].ptr_ + 0x40);
  base->ptr_ = pcVar1;
  base->capacity_ = lVar3 - (long)pcVar1;
  base->size_ = 0;
  return;
}

Assistant:

static void grow(buffer<char>& base, size_t) {
    auto& self = static_cast<file_print_buffer&>(base);
    self.file_.advance_write_buffer(self.size());
    if (self.file_.get_write_buffer().size == 0) self.file_.flush();
    auto buf = self.file_.get_write_buffer();
    FMT_ASSERT(buf.size > 0, "");
    self.set(buf.data, buf.size);
    self.clear();
  }